

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

string * Catch::Detail::StringMakerBase<true>::convert<bsim::quad_value_bit_vector>
                   (string *__return_storage_ptr__,quad_value_bit_vector *_value)

{
  ostringstream oss;
  string local_1a8;
  ostringstream local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  bsim::quad_value_bit_vector::binary_string_abi_cxx11_(&local_1a8,_value);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_188,local_1a8._M_dataplus._M_p,local_1a8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_188);
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert( T const& _value ) {
            std::ostringstream oss;
            oss << _value;
            return oss.str();
        }